

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O3

void __thiscall helics::tcp::TcpCommsSS::setFlag(TcpCommsSS *this,string_view flag,bool val)

{
  bool bVar1;
  int iVar2;
  long *__s1;
  size_t sVar3;
  size_type __rlen;
  
  __s1 = (long *)flag._M_str;
  sVar3 = flag._M_len;
  if (sVar3 == 9) {
    iVar2 = bcmp(__s1,"encrypted",9);
    if (iVar2 != 0) goto LAB_00268f46;
    bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
    if (!bVar1) {
      return;
    }
    (this->super_NetworkCommsInterface).encrypted = val;
  }
  else if (sVar3 == 0xe) {
    iVar2 = bcmp(__s1,"allow_outgoing",0xe);
    if (iVar2 != 0) goto LAB_00268f46;
    bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
    if (!bVar1) {
      return;
    }
    this->outgoingConnectionsAllowed = val;
  }
  else {
    if ((sVar3 != 0xd) ||
       (*(long *)((long)__s1 + 5) != 0x737365726464615f || *__s1 != 0x64615f6573756572)) {
LAB_00268f46:
      NetworkCommsInterface::setFlag(&this->super_NetworkCommsInterface,flag,val);
      return;
    }
    bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
    if (!bVar1) {
      return;
    }
    this->reuse_address = val;
  }
  CommsInterface::propertyUnLock((CommsInterface *)this);
  return;
}

Assistant:

void TcpCommsSS::setFlag(std::string_view flag, bool val)
{
    if (flag == "reuse_address") {
        if (propertyLock()) {
            reuse_address = val;
            propertyUnLock();
        }
    } else if (flag == "allow_outgoing") {
        if (propertyLock()) {
            outgoingConnectionsAllowed = val;
            propertyUnLock();
        }
    } else if (flag == "encrypted") {
        if (propertyLock()) {
            encrypted = val;
            propertyUnLock();
        }
    } else {
        NetworkCommsInterface::setFlag(flag, val);
    }
}